

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_table_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i alVar15;
  undefined1 auVar16 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i vH;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  int iVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  parasail_result_t *ppVar21;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  size_t __n;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  __m256i *palVar26;
  __m256i *palVar27;
  __m256i *palVar28;
  char *pcVar29;
  int iVar30;
  ulong uVar31;
  size_t sVar32;
  char *__format;
  int iVar33;
  int iVar34;
  uint seglen;
  int32_t t;
  ulong uVar35;
  int iVar36;
  int32_t d;
  ulong uVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar50 [16];
  undefined1 auVar46 [32];
  __m256i alVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 in_ZMM15 [64];
  int local_3b4;
  undefined1 local_378 [32];
  undefined1 local_358 [32];
  undefined1 local_2f8 [32];
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar29 = "profile";
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar29 = "profile->profile32.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar29 = "profile->matrix";
      }
      else {
        uVar20 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar29 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar29 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar29 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar29 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar7 = (profile->profile32).matches;
            pvVar8 = (profile->profile32).similar;
            iVar36 = ppVar6->min;
            uVar24 = 0x80000000 - iVar36;
            if (iVar36 != -open && SBORROW4(iVar36,-open) == iVar36 + open < 0) {
              uVar24 = open | 0x80000000;
            }
            iVar36 = 0x7ffffffe - ppVar6->max;
            ppVar21 = parasail_result_new_table3((uint)(uVar20 + 7) & 0x7ffffff8,s2Len);
            if (ppVar21 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar31 = uVar20 + 7 >> 3;
            ppVar21->flag = ppVar21->flag | 0x8430404;
            b = parasail_memalign___m256i(0x20,uVar31);
            b_00 = parasail_memalign___m256i(0x20,uVar31);
            b_01 = parasail_memalign___m256i(0x20,uVar31);
            b_02 = parasail_memalign___m256i(0x20,uVar31);
            b_03 = parasail_memalign___m256i(0x20,uVar31);
            b_04 = parasail_memalign___m256i(0x20,uVar31);
            b_05 = parasail_memalign___m256i(0x20,uVar31);
            b_06 = parasail_memalign___m256i(0x20,uVar31);
            ptr = parasail_memalign___m256i(0x20,uVar31);
            ptr_00 = parasail_memalign___m256i(0x20,uVar31);
            ptr_01 = parasail_memalign___m256i(0x20,uVar31);
            ptr_02 = parasail_memalign___m256i(0x20,uVar31);
            ptr_03 = parasail_memalign___m256i(0x20,uVar31);
            ptr_04 = parasail_memalign___m256i(0x20,uVar31);
            auVar45._8_8_ = 0;
            auVar45._0_8_ = b;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = b_00;
            auVar45 = vpunpcklqdq_avx(auVar45,auVar50);
            auVar39._8_8_ = 0;
            auVar39._0_8_ = b_01;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = b_02;
            auVar50 = vpunpcklqdq_avx(auVar39,auVar43);
            auVar39 = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar45;
            auVar43 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar50;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = b_03;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = b_04;
            auVar45 = vpunpcklqdq_avx(auVar44,auVar51);
            auVar52._8_8_ = 0;
            auVar52._0_8_ = b_05;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = b_06;
            auVar50 = vpunpcklqdq_avx(auVar52,auVar54);
            auVar45 = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar45;
            auVar50 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar50;
            auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40._0_8_ = -(ulong)(auVar39._0_8_ == 0);
            auVar40._8_8_ = -(ulong)(auVar39._8_8_ == 0);
            auVar40._16_8_ = -(ulong)(auVar43._0_8_ == 0);
            auVar40._24_8_ = -(ulong)(auVar43._8_8_ == 0);
            auVar46._0_8_ = -(ulong)(auVar45._0_8_ == 0);
            auVar46._8_8_ = -(ulong)(auVar45._8_8_ == 0);
            auVar46._16_8_ = -(ulong)(auVar50._0_8_ == 0);
            auVar46._24_8_ = -(ulong)(auVar50._8_8_ == 0);
            auVar40 = vpackssdw_avx2(auVar40,auVar46);
            if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0x7f,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0xbf,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar40[0x1f] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_03 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_04 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            iVar17 = uVar24 + 1;
            seglen = (uint)uVar31;
            auVar41._4_4_ = seglen;
            auVar41._0_4_ = seglen;
            auVar41._8_4_ = seglen;
            auVar41._12_4_ = seglen;
            auVar41._16_4_ = seglen;
            auVar41._20_4_ = seglen;
            auVar41._24_4_ = seglen;
            auVar41._28_4_ = seglen;
            auVar48 = vperm2i128_avx2(auVar41,auVar41,0x28);
            iVar30 = -(gap * seglen);
            auVar42._4_4_ = iVar30;
            auVar42._0_4_ = iVar30;
            auVar42._8_4_ = iVar30;
            auVar42._12_4_ = iVar30;
            auVar42._16_4_ = iVar30;
            auVar42._20_4_ = iVar30;
            auVar42._24_4_ = iVar30;
            auVar42._28_4_ = iVar30;
            auVar40 = vpblendd_avx2(auVar42,ZEXT1632((undefined1  [16])0x0),1);
            auVar42 = ZEXT1632(CONCAT124(SUB6412(ZEXT1664((undefined1  [16])0x0),4),iVar17));
            auVar40 = vpaddd_avx2(auVar42,auVar40);
            alVar15[0]._4_4_ = s2Len;
            alVar15[0]._0_4_ = iVar17;
            alVar15[1] = (longlong)b_05;
            alVar15[2] = (longlong)b_04;
            alVar15[3] = (longlong)b_03;
            iVar30 = iVar17;
            parasail_memset___m256i(b_03,alVar15,uVar31);
            alVar1[0]._4_4_ = s2Len;
            alVar1[0]._0_4_ = iVar30;
            alVar1[1] = (longlong)b_05;
            alVar1[2] = (longlong)b_04;
            alVar1[3] = (longlong)b_03;
            parasail_memset___m256i(b_04,alVar1,uVar31);
            alVar2[0]._4_4_ = s2Len;
            alVar2[0]._0_4_ = iVar30;
            alVar2[1] = (longlong)b_05;
            alVar2[2] = (longlong)b_04;
            alVar2[3] = (longlong)b_03;
            parasail_memset___m256i(b_05,alVar2,uVar31);
            c[0]._4_4_ = s2Len;
            c[0]._0_4_ = iVar30;
            c[1] = (longlong)b_05;
            c[2] = (longlong)b_04;
            c[3] = (longlong)b_03;
            parasail_memset___m256i(b_06,c,uVar31);
            c_00[0]._4_4_ = s2Len;
            c_00[0]._0_4_ = iVar30;
            c_00[1] = (longlong)b_05;
            c_00[2] = (longlong)b_04;
            c_00[3] = (longlong)b_03;
            parasail_memset___m256i(b,c_00,uVar31);
            c_01[0]._4_4_ = s2Len;
            c_01[0]._0_4_ = iVar30;
            c_01[1] = (longlong)b_05;
            c_01[2] = (longlong)b_04;
            c_01[3] = (longlong)b_03;
            parasail_memset___m256i(b_00,c_01,uVar31);
            c_02[0]._4_4_ = s2Len;
            c_02[0]._0_4_ = iVar30;
            c_02[1] = (longlong)b_05;
            c_02[2] = (longlong)b_04;
            c_02[3] = (longlong)b_03;
            parasail_memset___m256i(b_01,c_02,uVar31);
            c_03[0]._4_4_ = s2Len;
            c_03[0]._0_4_ = iVar30;
            c_03[1] = (longlong)b_05;
            c_03[2] = (longlong)b_04;
            c_03[3] = (longlong)b_03;
            parasail_memset___m256i(b_02,c_03,uVar31);
            auVar16._4_4_ = open;
            auVar16._0_4_ = open;
            auVar16._8_4_ = open;
            auVar16._12_4_ = open;
            auVar16._16_4_ = open;
            auVar16._20_4_ = open;
            auVar16._24_4_ = open;
            auVar16._28_4_ = open;
            alVar15 = (__m256i)vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16);
            uVar18 = seglen - 1;
            alVar47[1]._0_4_ = 1;
            alVar47[0] = 0x100000001;
            alVar47[1]._4_4_ = 1;
            alVar47[2]._0_4_ = 1;
            alVar47[2]._4_4_ = 1;
            alVar47[3]._0_4_ = 1;
            alVar47[3]._4_4_ = 1;
            auVar46 = vpcmpeqd_avx2(auVar53,auVar53);
            for (uVar24 = uVar18; -1 < (int)uVar24; uVar24 = uVar24 - 1) {
              ptr_03[uVar24] = alVar15;
              ptr_04[uVar24] = alVar47;
              auVar53._4_4_ = gap;
              auVar53._0_4_ = gap;
              auVar53._8_4_ = gap;
              auVar53._12_4_ = gap;
              auVar53._16_4_ = gap;
              auVar53._20_4_ = gap;
              auVar53._24_4_ = gap;
              auVar53._28_4_ = gap;
              alVar15 = (__m256i)vpsubd_avx2((undefined1  [32])alVar15,auVar53);
              alVar47 = (__m256i)vpsubd_avx2((undefined1  [32])alVar47,auVar46);
            }
            palVar26 = b_03 + uVar18;
            palVar27 = b_04 + uVar18;
            palVar28 = b_05 + uVar18;
            auVar46 = vpalignr_avx2(auVar41,auVar48,0xc);
            __n = uVar31 << 5;
            uVar22 = (ulong)(uint)s2Len;
            local_1f8._4_4_ = iVar36;
            local_1f8._0_4_ = iVar36;
            local_1f8._12_4_ = iVar36;
            local_1f8._8_4_ = iVar36;
            local_1f8._20_4_ = iVar36;
            local_1f8._16_4_ = iVar36;
            local_1f8._28_4_ = iVar36;
            local_1f8._24_4_ = iVar36;
            local_278._4_4_ = iVar17;
            local_278._0_4_ = iVar17;
            local_278._8_4_ = iVar17;
            local_278._12_4_ = iVar17;
            local_278._16_4_ = iVar17;
            local_278._20_4_ = iVar17;
            local_278._24_4_ = iVar17;
            local_278._28_4_ = iVar17;
            local_3b4 = 0;
            local_218 = local_278;
            local_198 = local_278;
            for (uVar37 = 0; uVar37 != uVar22; uVar37 = uVar37 + 1) {
              alVar15 = *palVar26;
              alVar47 = *palVar27;
              alVar1 = *palVar28;
              alVar2 = b_06[uVar18];
              auVar53 = vperm2i128_avx2((undefined1  [32])alVar15,(undefined1  [32])alVar15,0x28);
              auVar53 = vpalignr_avx2((undefined1  [32])alVar15,auVar53,0xc);
              auVar48 = vperm2i128_avx2((undefined1  [32])alVar47,(undefined1  [32])alVar47,0x28);
              auVar48 = vpalignr_avx2((undefined1  [32])alVar47,auVar48,0xc);
              auVar16 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar16 = vpalignr_avx2((undefined1  [32])alVar1,auVar16,0xc);
              auVar41 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
              auVar41 = vpalignr_avx2((undefined1  [32])alVar2,auVar41,0xc);
              lVar23 = (long)(int)(ppVar6->mapper[(byte)s2[uVar37]] * seglen) * 0x20;
              local_2f8 = ZEXT1632(ZEXT816(0));
              auVar57 = ZEXT1664((undefined1  [16])0x0);
              sVar32 = 0;
              auVar14._4_4_ = iVar17;
              auVar14._0_4_ = iVar17;
              auVar14._8_4_ = iVar17;
              auVar14._12_4_ = iVar17;
              auVar14._16_4_ = iVar17;
              auVar14._20_4_ = iVar17;
              auVar14._24_4_ = iVar17;
              auVar14._28_4_ = iVar17;
              local_378 = ZEXT1632(ZEXT816(0));
              local_358 = ZEXT1632(ZEXT816(0));
              while( true ) {
                auVar56 = auVar57._0_32_;
                auVar58 = in_ZMM15._0_32_;
                if (__n == sVar32) break;
                auVar49 = *(undefined1 (*) [32])((long)*b_03 + sVar32);
                auVar55 = *(undefined1 (*) [32])((long)*b_04 + sVar32);
                auVar3 = *(undefined1 (*) [32])((long)*b_05 + sVar32);
                auVar4 = *(undefined1 (*) [32])((long)*b_06 + sVar32);
                auVar9 = vpaddd_avx2(auVar56,*(undefined1 (*) [32])((long)*ptr_03 + sVar32));
                auVar11 = vpcmpgtd_avx2(auVar9,auVar14);
                local_2f8 = vblendvps_avx(local_2f8,auVar58,auVar11);
                local_378 = vblendvps_avx(local_378,local_178,auVar11);
                auVar56 = vpaddd_avx2(local_258,*(undefined1 (*) [32])((long)*ptr_04 + sVar32));
                local_358 = vblendvps_avx(local_358,auVar56,auVar11);
                auVar56._4_4_ = open;
                auVar56._0_4_ = open;
                auVar56._8_4_ = open;
                auVar56._12_4_ = open;
                auVar56._16_4_ = open;
                auVar56._20_4_ = open;
                auVar56._24_4_ = open;
                auVar56._28_4_ = open;
                auVar56 = vpsubd_avx2(auVar49,auVar56);
                auVar11._4_4_ = gap;
                auVar11._0_4_ = gap;
                auVar11._8_4_ = gap;
                auVar11._12_4_ = gap;
                auVar11._16_4_ = gap;
                auVar11._20_4_ = gap;
                auVar11._24_4_ = gap;
                auVar11._28_4_ = gap;
                auVar58 = vpsubd_avx2(*(undefined1 (*) [32])((long)*b + sVar32),auVar11);
                auVar12 = vpcmpgtd_avx2(auVar56,auVar58);
                auVar13 = vpmaxsd_avx2(auVar56,auVar58);
                auVar56 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_00 + sVar32),auVar55,auVar12
                                       );
                auVar58 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_01 + sVar32),auVar3,auVar12)
                ;
                auVar11 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_02 + sVar32),auVar4,auVar12)
                ;
                auVar10 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])((long)pvVar5 + sVar32 + lVar23)
                                     );
                auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])((long)pvVar7 + sVar32 + lVar23)
                                     );
                auVar16 = vpaddd_avx2(auVar16,*(undefined1 (*) [32])((long)pvVar8 + sVar32 + lVar23)
                                     );
                auVar53 = vpcmpeqd_avx2(auVar12,auVar12);
                auVar12 = vpsubd_avx2(auVar41,auVar53);
                auVar11 = vpsubd_avx2(auVar11,auVar53);
                auVar14 = vpmaxsd_avx2(auVar14,auVar9);
                auVar41 = vpcmpgtd_avx2(auVar13,auVar10);
                *(undefined1 (*) [32])((long)*b + sVar32) = auVar13;
                *(undefined1 (*) [32])((long)*b_00 + sVar32) = auVar56;
                auVar53 = vblendvps_avx(auVar48,auVar56,auVar41);
                in_ZMM15 = ZEXT3264(auVar53);
                *(undefined1 (*) [32])((long)*b_01 + sVar32) = auVar58;
                local_178 = vblendvps_avx(auVar16,auVar58,auVar41);
                local_258 = vblendvps_avx(auVar12,auVar11,auVar41);
                *(undefined1 (*) [32])((long)*b_02 + sVar32) = auVar11;
                *(undefined1 (*) [32])((long)*b_03 + sVar32) = auVar10;
                *(undefined1 (*) [32])((long)*b_04 + sVar32) = auVar48;
                *(undefined1 (*) [32])((long)*b_05 + sVar32) = auVar16;
                auVar53 = vpmaxsd_avx2(auVar13,auVar10);
                auVar57 = ZEXT3264(auVar53);
                *(undefined1 (*) [32])((long)*b_06 + sVar32) = auVar12;
                sVar32 = sVar32 + 0x20;
                auVar53 = auVar49;
                auVar48 = auVar55;
                auVar16 = auVar3;
                auVar41 = auVar4;
              }
              auVar53 = vperm2i128_avx2(auVar56,auVar56,0x28);
              auVar41 = vpalignr_avx2(auVar56,auVar53,0xc);
              auVar53 = vperm2i128_avx2(auVar58,auVar58,0x28);
              auVar56 = vpalignr_avx2(auVar58,auVar53,0xc);
              auVar53 = vperm2i128_avx2(local_178,local_178,0x28);
              local_178 = vpalignr_avx2(local_178,auVar53,0xc);
              auVar53 = vperm2i128_avx2(local_258,local_258,0x28);
              local_258 = vpalignr_avx2(local_258,auVar53,0xc);
              auVar53 = vpaddd_avx2(auVar41,(undefined1  [32])*ptr_03);
              auVar58 = vpcmpgtd_avx2(auVar14,auVar53);
              auVar14 = vpmaxsd_avx2(auVar14,auVar53);
              auVar16 = vblendvps_avx(auVar56,local_2f8,auVar58);
              auVar48 = vblendvps_avx(local_178,local_378,auVar58);
              auVar53 = vpaddd_avx2(local_258,(undefined1  [32])*ptr_04);
              auVar53 = vblendvps_avx(auVar53,local_358,auVar58);
              iVar19 = 6;
              while( true ) {
                auVar58 = vperm2f128_avx(auVar14,auVar14,0x28);
                auVar49 = vperm2f128_avx(auVar16,auVar16,0x28);
                auVar55 = vperm2f128_avx(auVar48,auVar48,0x28);
                auVar3 = vperm2f128_avx(auVar53,auVar53,0x28);
                bVar38 = iVar19 == 0;
                iVar19 = iVar19 + -1;
                if (bVar38) break;
                auVar58 = vpalignr_avx2(auVar14,auVar58,0xc);
                auVar58 = vpaddd_avx2(auVar58,auVar40);
                auVar4 = vpcmpgtd_avx2(auVar14,auVar58);
                auVar49 = vpalignr_avx2(auVar16,auVar49,0xc);
                auVar16 = vblendvps_avx(auVar49,auVar16,auVar4);
                auVar14 = vpmaxsd_avx2(auVar14,auVar58);
                auVar58 = vpalignr_avx2(auVar48,auVar55,0xc);
                auVar48 = vblendvps_avx(auVar58,auVar48,auVar4);
                auVar58 = vpalignr_avx2(auVar53,auVar3,0xc);
                auVar58 = vpaddd_avx2(auVar58,auVar46);
                auVar53 = vblendvps_avx(auVar58,auVar53,auVar4);
              }
              auVar14 = vpalignr_avx2(auVar14,auVar58,0xc);
              local_d8 = vpaddd_avx2(auVar14,auVar42);
              auVar14 = vpcmpgtd_avx2(local_d8,auVar41);
              auVar41 = vpmaxsd_avx2(local_d8,auVar41);
              local_f8 = vpalignr_avx2(auVar16,auVar49,0xc);
              local_2f8 = vblendvps_avx(auVar56,local_f8,auVar14);
              local_118 = vpalignr_avx2(auVar48,auVar55,0xc);
              local_358 = vblendvps_avx(local_178,local_118,auVar14);
              local_138 = vpalignr_avx2(auVar53,auVar3,0xc);
              local_378 = vblendvps_avx(local_258,local_138,auVar14);
              lVar23 = 0;
              for (uVar35 = 0; d = (int32_t)uVar37, uVar31 != uVar35; uVar35 = uVar35 + 1) {
                auVar53 = *(undefined1 (*) [32])((long)*b_03 + lVar23);
                auVar48._4_4_ = open;
                auVar48._0_4_ = open;
                auVar48._8_4_ = open;
                auVar48._12_4_ = open;
                auVar48._16_4_ = open;
                auVar48._20_4_ = open;
                auVar48._24_4_ = open;
                auVar48._28_4_ = open;
                auVar48 = vpsubd_avx2(auVar41,auVar48);
                auVar58._4_4_ = gap;
                auVar58._0_4_ = gap;
                auVar58._8_4_ = gap;
                auVar58._12_4_ = gap;
                auVar58._16_4_ = gap;
                auVar58._20_4_ = gap;
                auVar58._24_4_ = gap;
                auVar58._28_4_ = gap;
                auVar16 = vpsubd_avx2(local_d8,auVar58);
                local_d8 = vpmaxsd_avx2(auVar48,auVar16);
                auVar48 = vpcmpgtd_avx2(auVar48,auVar16);
                local_f8 = vblendvps_avx(local_f8,local_2f8,auVar48);
                local_118 = vblendvps_avx(local_118,local_358,auVar48);
                auVar48 = vblendvps_avx(local_138,local_378,auVar48);
                local_138 = vpsubd_avx2(auVar48,_DAT_008a5a80);
                auVar48 = vpmaxsd_avx2(auVar53,*(undefined1 (*) [32])((long)*b + lVar23));
                auVar49 = vpmaxsd_avx2(auVar48,local_d8);
                auVar41 = vpmaxsd_avx2(auVar49,_DAT_008a5840);
                auVar14 = vpcmpeqd_avx2(auVar41,local_d8);
                auVar48 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_00 + lVar23),local_f8,
                                        auVar14);
                auVar16 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_01 + lVar23),local_118,
                                        auVar14);
                auVar14 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_02 + lVar23),local_138,
                                        auVar14);
                auVar58 = vpcmpeqd_avx2(auVar41,auVar53);
                auVar53 = vblendvps_avx(auVar48,*(undefined1 (*) [32])((long)*b_04 + lVar23),auVar58
                                       );
                auVar48 = vblendvps_avx(auVar16,*(undefined1 (*) [32])((long)*b_05 + lVar23),auVar58
                                       );
                auVar16 = vblendvps_avx(auVar14,*(undefined1 (*) [32])((long)*b_06 + lVar23),auVar58
                                       );
                auVar55._8_4_ = 1;
                auVar55._0_8_ = 0x100000001;
                auVar55._12_4_ = 1;
                auVar55._16_4_ = 1;
                auVar55._20_4_ = 1;
                auVar55._24_4_ = 1;
                auVar55._28_4_ = 1;
                auVar14 = vpcmpgtd_avx2(auVar55,auVar49);
                local_2f8 = vpandn_avx2(auVar14,auVar53);
                local_358 = vpandn_avx2(auVar14,auVar48);
                local_378 = vpandn_avx2(auVar14,auVar16);
                auVar53 = vpmaxsd_avx2(auVar41,local_218);
                auVar53 = vpmaxsd_avx2(auVar53,local_2f8);
                auVar48 = vpmaxsd_avx2(local_358,local_378);
                local_218 = vpmaxsd_avx2(auVar53,auVar48);
                *(undefined1 (*) [32])((long)*b_03 + lVar23) = auVar41;
                *(undefined1 (*) [32])((long)*b_04 + lVar23) = local_2f8;
                *(undefined1 (*) [32])((long)*b_05 + lVar23) = local_358;
                *(undefined1 (*) [32])((long)*b_06 + lVar23) = local_378;
                local_1f8 = vpminsd_avx2(local_1f8,auVar41);
                t = (int32_t)uVar35;
                vH[0]._4_4_ = s2Len;
                vH[0]._0_4_ = iVar30;
                vH[1] = (longlong)b_05;
                vH[2] = (longlong)b_04;
                vH[3] = (longlong)b_03;
                uVar24 = s2Len;
                arr_store_si256(*((ppVar21->field_4).trace)->trace_del_table,vH,t,seglen,d,s2Len);
                vH_00[0]._4_4_ = uVar24;
                vH_00[0]._0_4_ = iVar30;
                vH_00[1] = (longlong)b_05;
                vH_00[2] = (longlong)b_04;
                vH_00[3] = (longlong)b_03;
                arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table + 8),
                                vH_00,t,seglen,d,s2Len);
                vH_01[0]._4_4_ = uVar24;
                vH_01[0]._0_4_ = iVar30;
                vH_01[1] = (longlong)b_05;
                vH_01[2] = (longlong)b_04;
                vH_01[3] = (longlong)b_03;
                arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table + 0x10),
                                vH_01,t,seglen,d,s2Len);
                vH_02[0]._4_4_ = uVar24;
                vH_02[0]._0_4_ = iVar30;
                vH_02[1] = (longlong)b_05;
                vH_02[2] = (longlong)b_04;
                vH_02[3] = (longlong)b_03;
                arr_store_si256(*(int **)((long)((ppVar21->field_4).trace)->trace_del_table + 0x18),
                                vH_02,t,seglen,d,s2Len);
                local_278 = vpmaxsd_avx2(auVar41,local_278);
                lVar23 = lVar23 + 0x20;
                s2Len = uVar24;
              }
              auVar53 = vpcmpgtd_avx2(local_278,local_198);
              if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar53 >> 0x7f,0) != '\0') ||
                    (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar53 >> 0xbf,0) != '\0') ||
                  (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar53[0x1f] < '\0') {
                auVar53 = vpermq_avx2(local_278,0x44);
                auVar53 = vpmaxsd_avx2(local_278,auVar53);
                auVar48 = vpslldq_avx2(auVar53,8);
                auVar53 = vpmaxsd_avx2(auVar53,auVar48);
                auVar48 = vpslldq_avx2(auVar53,4);
                auVar53 = vpmaxsd_avx2(auVar53,auVar48);
                iVar30 = auVar53._28_4_;
                auVar49._8_4_ = 7;
                auVar49._0_8_ = 0x700000007;
                auVar49._12_4_ = 7;
                auVar49._16_4_ = 7;
                auVar49._20_4_ = 7;
                auVar49._24_4_ = 7;
                auVar49._28_4_ = 7;
                local_198 = vpermd_avx2(auVar49,auVar53);
                memcpy(ptr,b_03,__n);
                memcpy(ptr_00,b_04,__n);
                memcpy(ptr_01,b_05,__n);
                memcpy(ptr_02,b_06,__n);
                local_3b4 = d;
              }
              in_ZMM15 = ZEXT3264(auVar56);
            }
            uVar31 = 0;
            iVar19 = 0;
            iVar25 = 0;
            iVar34 = 0;
            while( true ) {
              iVar33 = (int)uVar20;
              if ((seglen & 0xfffffff) << 3 == (uint)uVar31) break;
              if ((*(int *)((long)*ptr + uVar31 * 4) == iVar30) &&
                 (uVar24 = ((uint)uVar31 & 7) * seglen + ((uint)(uVar31 >> 3) & 0x1fffffff),
                 (int)uVar24 < iVar33)) {
                iVar19 = *(int *)((long)*ptr_00 + uVar31 * 4);
                iVar25 = *(int *)((long)*ptr_01 + uVar31 * 4);
                iVar34 = *(int *)((long)*ptr_02 + uVar31 * 4);
                uVar20 = (ulong)uVar24;
              }
              uVar31 = uVar31 + 1;
            }
            auVar3._4_4_ = iVar17;
            auVar3._0_4_ = iVar17;
            auVar3._8_4_ = iVar17;
            auVar3._12_4_ = iVar17;
            auVar3._16_4_ = iVar17;
            auVar3._20_4_ = iVar17;
            auVar3._24_4_ = iVar17;
            auVar3._28_4_ = iVar17;
            auVar40 = vpcmpgtd_avx2(auVar3,local_1f8);
            auVar4._4_4_ = iVar36;
            auVar4._0_4_ = iVar36;
            auVar4._8_4_ = iVar36;
            auVar4._12_4_ = iVar36;
            auVar4._16_4_ = iVar36;
            auVar4._20_4_ = iVar36;
            auVar4._24_4_ = iVar36;
            auVar4._28_4_ = iVar36;
            auVar46 = vpcmpgtd_avx2(local_218,auVar4);
            auVar40 = vpor_avx2(auVar46,auVar40);
            if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0x7f,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0xbf,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar40[0x1f] < '\0') {
              *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
              iVar30 = 0;
              iVar19 = 0;
              iVar25 = 0;
              iVar34 = 0;
              local_3b4 = 0;
              iVar33 = 0;
            }
            ppVar21->score = iVar30;
            ppVar21->end_query = iVar33;
            ppVar21->end_ref = local_3b4;
            ((ppVar21->field_4).stats)->matches = iVar19;
            ((ppVar21->field_4).stats)->similar = iVar25;
            ((ppVar21->field_4).stats)->length = iVar34;
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(b_00);
            parasail_free(b);
            return ppVar21;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar29 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_stats_table_scan_profile_avx2_256_32",pcVar29);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile32.score;
    pvPm = (__m256i*)profile->profile32.matches;
    pvPs = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi32(segLen), 4);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
            vGapperL = _mm256_add_epi32(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHpM = _mm256_slli_si256_rpl(vHpM, 4);
        vHpS = _mm256_slli_si256_rpl(vHpS, 4);
        vHpL = _mm256_slli_si256_rpl(vHpL, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi32(vH, vGapO);
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            case1 = _mm256_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm256_max_epi32(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi32(vEL, vOne);
            vGapper = _mm256_add_epi32(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vF, vGapper),
                    _mm256_cmpeq_epi32(vF, vGapper));
            vF = _mm256_max_epi32(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi32(vHp, vW);
            vHpM = _mm256_add_epi32(vHpM, vWM);
            vHpS = _mm256_add_epi32(vHpS, vWS);
            vHpL = _mm256_add_epi32(vHpL, vOne);
            case1 = _mm256_cmpgt_epi32(vE, vHp);
            vHt = _mm256_max_epi32(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHtM = _mm256_slli_si256_rpl(vHtM, 4);
        vHtS = _mm256_slli_si256_rpl(vHtS, 4);
        vHtL = _mm256_slli_si256_rpl(vHtL, 4);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi32(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi32(vGapper, vF),
                _mm256_cmpeq_epi32(vGapper, vF));
        vF = _mm256_max_epi32(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 4);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 4);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vFt, vF),
                    _mm256_cmpeq_epi32(vFt, vF));
            vF = _mm256_max_epi32(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vFM = _mm256_slli_si256_rpl(vFM, 4);
        vFS = _mm256_slli_si256_rpl(vFS, 4);
        vFL = _mm256_slli_si256_rpl(vFL, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi32(vF, vHt);
        vH = _mm256_max_epi32(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi32(vH, vGapO);
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi32(vFL, vOne);
            vH = _mm256_max_epi32(vHp, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            case1 = _mm256_cmpeq_epi32(vH, vHp);
            case2 = _mm256_cmpeq_epi32(vH, vF);
            case0 = _mm256_cmpeq_epi32(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi32(vH, vMaxH);
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t *m = (int32_t*)pvHMMax;
        int32_t *s = (int32_t*)pvHSMax;
        int32_t *l = (int32_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}